

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * cmQtAutoGen::GeneratorName_abi_cxx11_(GenT genType)

{
  int iVar1;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  GenT local_14;
  string *psStack_10;
  GenT genType_local;
  
  local_14 = genType;
  if ((GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_,"AutoGen",
               &local_15);
    std::allocator<char>::~allocator(&local_15);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_);
  }
  if ((GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_,"AutoMoc",
               local_25);
    std::allocator<char>::~allocator(local_25);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_);
  }
  if ((GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_,"AutoUic",
               &local_26);
    std::allocator<char>::~allocator(&local_26);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_);
  }
  if ((GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_,"AutoRcc",
               &local_27);
    std::allocator<char>::~allocator(&local_27);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_);
  }
  switch(local_14) {
  case GEN:
    psStack_10 = &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_;
    break;
  case MOC:
    psStack_10 = &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoMoc_abi_cxx11_;
    break;
  case UIC:
    psStack_10 = &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoUic_abi_cxx11_;
    break;
  case RCC:
    psStack_10 = &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoRcc_abi_cxx11_;
    break;
  default:
    psStack_10 = &GeneratorName[abi:cxx11](cmQtAutoGen::GenT)::AutoGen_abi_cxx11_;
  }
  return psStack_10;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorName(GenT genType)
{
  static const std::string AutoGen("AutoGen");
  static const std::string AutoMoc("AutoMoc");
  static const std::string AutoUic("AutoUic");
  static const std::string AutoRcc("AutoRcc");

  switch (genType) {
    case GenT::GEN:
      return AutoGen;
    case GenT::MOC:
      return AutoMoc;
    case GenT::UIC:
      return AutoUic;
    case GenT::RCC:
      return AutoRcc;
  }
  return AutoGen;
}